

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O1

void cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(cmGeneratorTarget *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmSourceFile *pcVar3;
  pointer pcVar4;
  cmMakefile *pcVar5;
  _Alloc_hider infile;
  size_type sVar6;
  _Alloc_hider outfile;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  FileFormat FVar11;
  string *psVar12;
  char *pcVar13;
  char *pcVar14;
  string *psVar15;
  char *pcVar16;
  long *plVar17;
  cmMakefile *pcVar18;
  size_t sVar19;
  mapped_type *pmVar20;
  cmGeneratorTarget *pcVar21;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var22;
  char **ppcVar23;
  ostream *poVar24;
  _Base_ptr p_Var25;
  _Rb_tree_node_base *p_Var26;
  size_type *psVar27;
  iterator it;
  undefined8 uVar28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer pbVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar30;
  pointer __v;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar31;
  string inputFile;
  string opts;
  size_type __dnew_2;
  string outputFile;
  mode_t perm;
  string rcc_output_dir;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newRccFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccOptions;
  string absFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configIncludes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  skipUic;
  string autogenTargetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mocHeaders;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mocSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  skipMoc;
  string targetDir;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configUicOptions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configDefines;
  string local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  cmMakefile *local_4a8;
  cmGeneratorTarget *local_4a0;
  undefined1 local_498 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  cmMakefile *local_458;
  cmMakefile *local_450;
  char *local_448;
  cmMakefile *local_440;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  undefined1 local_418 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  _Base_ptr local_3f8;
  size_t local_3f0;
  ios_base local_320 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_1f8;
  undefined1 local_1d8 [32];
  _Rb_tree_node_base *local_1b8;
  size_t local_1b0;
  string local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  string local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  string local_f0;
  string local_d0;
  string local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_4a8 = target->Target->Makefile;
  cmMakefile::PushScope(local_4a8);
  GetAutogenTargetName_abi_cxx11_(&local_168,target);
  local_418 = (undefined1  [8])&local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"_moc_target_name","");
  cmOutputConverter::EscapeForCMake((string *)local_1d8,&local_168);
  cmMakefile::AddDefinition(local_4a8,(string *)local_418,(char *)local_1d8._0_8_);
  pcVar16 = local_1d8 + 0x10;
  if ((char *)local_1d8._0_8_ != pcVar16) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  if (local_418 != (undefined1  [8])&local_408) {
    operator_delete((void *)local_418,
                    CONCAT17(local_408._M_local_buf[7],
                             CONCAT61(local_408._M_allocated_capacity._1_6_,
                                      local_408._M_local_buf[0])) + 1);
  }
  local_418 = (undefined1  [8])&local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"_origin_target_name","");
  psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  cmOutputConverter::EscapeForCMake((string *)local_1d8,psVar12);
  cmMakefile::AddDefinition(local_4a8,(string *)local_418,(char *)local_1d8._0_8_);
  if ((char *)local_1d8._0_8_ != pcVar16) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  if (local_418 != (undefined1  [8])&local_408) {
    operator_delete((void *)local_418,
                    CONCAT17(local_408._M_local_buf[7],
                             CONCAT61(local_408._M_allocated_capacity._1_6_,
                                      local_408._M_local_buf[0])) + 1);
  }
  GetAutogenTargetDir_abi_cxx11_(&local_b0,target);
  local_418 = (undefined1  [8])&local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"Qt5Core_VERSION_MAJOR","");
  pcVar13 = cmMakefile::GetDefinition(local_4a8,(string *)local_418);
  if (local_418 != (undefined1  [8])&local_408) {
    operator_delete((void *)local_418,
                    CONCAT17(local_408._M_local_buf[7],
                             CONCAT61(local_408._M_allocated_capacity._1_6_,
                                      local_408._M_local_buf[0])) + 1);
  }
  if (pcVar13 == (char *)0x0) {
    local_418 = (undefined1  [8])&local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"QT_VERSION_MAJOR","");
    pcVar13 = cmMakefile::GetDefinition(local_4a8,(string *)local_418);
    if (local_418 != (undefined1  [8])&local_408) {
      operator_delete((void *)local_418,
                      CONCAT17(local_408._M_local_buf[7],
                               CONCAT61(local_408._M_allocated_capacity._1_6_,
                                        local_408._M_local_buf[0])) + 1);
    }
  }
  local_418 = (undefined1  [8])&local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"QT_MAJOR_VERSION","");
  local_448 = "";
  local_1d8._0_8_ = pcVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"");
  pcVar14 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                      (target,(string *)local_418,(string *)local_1d8);
  if ((char *)local_1d8._0_8_ != pcVar16) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  if (local_418 != (undefined1  [8])&local_408) {
    operator_delete((void *)local_418,
                    CONCAT17(local_408._M_local_buf[7],
                             CONCAT61(local_408._M_allocated_capacity._1_6_,
                                      local_408._M_local_buf[0])) + 1);
  }
  if (pcVar14 != (char *)0x0) {
    pcVar13 = pcVar14;
  }
  if (pcVar13 != (char *)0x0) {
    local_418 = (undefined1  [8])&local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"_target_qt_version","");
    cmMakefile::AddDefinition(local_4a8,(string *)local_418,pcVar13);
    if (local_418 != (undefined1  [8])&local_408) {
      operator_delete((void *)local_418,
                      CONCAT17(local_408._M_local_buf[7],
                               CONCAT61(local_408._M_allocated_capacity._1_6_,
                                        local_408._M_local_buf[0])) + 1);
    }
  }
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8._24_8_ = local_1d8 + 8;
  local_1d8._8_4_ = _S_red;
  local_1d8._16_8_ = 0;
  local_1b0 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_418 = (undefined1  [8])&local_408;
  local_1b8 = (_Rb_tree_node_base *)local_1d8._24_8_;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"AUTOMOC","");
  bVar7 = cmGeneratorTarget::GetPropertyAsBool(target,(string *)local_418);
  bVar9 = true;
  if (bVar7) {
LAB_002f0412:
    bVar8 = false;
  }
  else {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"AUTOUIC","");
    bVar8 = cmGeneratorTarget::GetPropertyAsBool(target,&local_d0);
    if (bVar8) goto LAB_002f0412;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"AUTORCC","");
    bVar9 = cmGeneratorTarget::GetPropertyAsBool(target,&local_f0);
    bVar8 = true;
  }
  if ((bVar8) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar7) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2)) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_418 != (undefined1  [8])&local_408) {
    operator_delete((void *)local_418,
                    CONCAT17(local_408._M_local_buf[7],
                             CONCAT61(local_408._M_allocated_capacity._1_6_,
                                      local_408._M_local_buf[0])) + 1);
  }
  local_4a0 = target;
  if (bVar9 != false) {
    local_440 = target->Target->Makefile;
    local_498._0_8_ = (string *)0x0;
    local_498._8_8_ = (string *)0x0;
    local_498[0x10] = '\0';
    local_498._17_6_ = 0;
    local_498[0x17] = '\0';
    cmGeneratorTarget::GetConfigCommonSourceFiles
              (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_498);
    local_478._M_allocated_capacity = 0;
    local_478._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_468._M_allocated_capacity = 0;
    if (local_498._0_8_ != local_498._8_8_) {
      paVar1 = &local_568.field_2;
      paVar2 = &local_528.field_2;
      psVar12 = (string *)local_498._0_8_;
      do {
        pcVar3 = (cmSourceFile *)(psVar12->_M_dataplus)._M_p;
        psVar15 = cmSourceFile::GetFullPath(pcVar3,(string *)0x0);
        cmsys::SystemTools::GetRealPath((string *)local_418,psVar15,(string *)0x0);
        local_568.field_2._M_allocated_capacity = 0x5455415f50494b53;
        local_568.field_2._8_4_ = 0x434f4d4f;
        local_568._M_string_length = 0xc;
        local_568.field_2._M_local_buf[0xc] = '\0';
        local_568._M_dataplus._M_p = (pointer)paVar1;
        pcVar16 = cmSourceFile::GetPropertyForUser(pcVar3,&local_568);
        bVar7 = cmSystemTools::IsOn(pcVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != paVar1) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
        }
        local_568.field_2._M_allocated_capacity = 0x45544152454e4547;
        local_568._M_string_length = 9;
        local_568.field_2._8_2_ = 0x44;
        local_568._M_dataplus._M_p = (pointer)paVar1;
        pcVar16 = cmSourceFile::GetPropertyForUser(pcVar3,&local_568);
        bVar9 = cmSystemTools::IsOn(pcVar16);
        local_458 = (cmMakefile *)CONCAT71(local_458._1_7_,bVar9);
        local_450 = (cmMakefile *)CONCAT71(local_450._1_7_,bVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != paVar1) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
        }
        local_568.field_2._M_allocated_capacity = 0x5455415f50494b53;
        local_568.field_2._8_4_ = 0x4349554f;
        local_568._M_string_length = 0xc;
        local_568.field_2._M_local_buf[0xc] = '\0';
        local_568._M_dataplus._M_p = (pointer)paVar1;
        pcVar16 = cmSourceFile::GetPropertyForUser(pcVar3,&local_568);
        bVar7 = cmSystemTools::IsOn(pcVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != paVar1) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
        }
        if (bVar7) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_188,(value_type *)local_418);
        }
        psVar15 = cmSourceFile::GetExtension_abi_cxx11_(pcVar3);
        pcVar4 = (psVar15->_M_dataplus)._M_p;
        local_568._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_568,pcVar4,pcVar4 + psVar15->_M_string_length);
        local_508.field_2._M_local_buf[0] = 'A';
        local_508.field_2._M_allocated_capacity._1_2_ = 0x5455;
        local_508.field_2._M_allocated_capacity._3_4_ = 0x4343524f;
        local_508._M_string_length = 7;
        local_508.field_2._M_local_buf[7] = '\0';
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        bVar7 = cmGeneratorTarget::GetPropertyAsBool(local_4a0,&local_508);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,
                          CONCAT17(local_508.field_2._M_local_buf[7],
                                   CONCAT43(local_508.field_2._M_allocated_capacity._3_4_,
                                            CONCAT21(local_508.field_2._M_allocated_capacity._1_2_,
                                                     local_508.field_2._M_local_buf[0]))) + 1);
        }
        if (bVar7) {
          iVar10 = std::__cxx11::string::compare((char *)&local_568);
          if (iVar10 == 0) {
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            local_1a8.field_2._M_allocated_capacity = 0x5455415f50494b53;
            local_1a8.field_2._8_4_ = 0x4343524f;
            local_1a8._M_string_length = 0xc;
            local_1a8.field_2._M_local_buf[0xc] = '\0';
            pcVar16 = cmSourceFile::GetPropertyForUser(pcVar3,&local_1a8);
            bVar7 = cmSystemTools::IsOn(pcVar16);
            bVar7 = !bVar7;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            bVar7 = false;
          }
          if (bVar7) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_508,(string *)local_418);
            cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_4c8,local_4a0);
            cmsys::SystemTools::MakeDirectory(local_4c8._M_dataplus._M_p);
            local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4e8,local_4c8._M_dataplus._M_p,
                       local_4c8._M_dataplus._M_p + local_4c8._M_string_length);
            std::operator+(&local_548,"/qrc_",&local_508);
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_548);
            psVar27 = (size_type *)(plVar17 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_528.field_2._M_allocated_capacity = *psVar27;
              local_528.field_2._8_8_ = plVar17[3];
              local_528._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_528.field_2._M_allocated_capacity = *psVar27;
              local_528._M_dataplus._M_p = (pointer)*plVar17;
            }
            local_528._M_string_length = plVar17[1];
            *plVar17 = (long)psVar27;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_4e8,(ulong)local_528._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_dataplus._M_p != paVar2) {
              operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p != &local_548.field_2) {
              operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1
                             );
            }
            local_548._M_dataplus._M_p = (pointer)0x1b;
            local_528._M_dataplus._M_p = (pointer)paVar2;
            local_528._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_528,(ulong)&local_548);
            local_528.field_2._M_allocated_capacity = (size_type)local_548._M_dataplus._M_p;
            builtin_strncpy((char *)((long)local_528._M_dataplus._M_p + 0xb),"MAKE_CLE",8);
            builtin_strncpy((char *)((long)local_528._M_dataplus._M_p + 0x13),"AN_FILES",8);
            *(undefined8 *)local_528._M_dataplus._M_p = 0x4e4f495449444441;
            *(undefined8 *)((long)local_528._M_dataplus._M_p + 8) = 0x5f454b414d5f4c41;
            local_528._M_string_length = (size_type)local_548._M_dataplus._M_p;
            local_528._M_dataplus._M_p[(long)local_548._M_dataplus._M_p] = '\0';
            cmMakefile::AppendProperty(local_440,&local_528,local_4e8._M_dataplus._M_p,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_dataplus._M_p != paVar2) {
              operator_delete(local_528._M_dataplus._M_p,
                              (ulong)(local_528.field_2._M_allocated_capacity + 1));
            }
            cmMakefile::GetOrCreateSource(local_440,&local_4e8,true);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_478,&local_4e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
              operator_delete(local_4e8._M_dataplus._M_p,
                              (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
              operator_delete(local_4c8._M_dataplus._M_p,
                              (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_508._M_dataplus._M_p != &local_508.field_2) {
              operator_delete(local_508._M_dataplus._M_p,
                              CONCAT17(local_508.field_2._M_local_buf[7],
                                       CONCAT43(local_508.field_2._M_allocated_capacity._3_4_,
                                                CONCAT21(local_508.field_2._M_allocated_capacity.
                                                         _1_2_,local_508.field_2._M_local_buf[0])))
                              + 1);
            }
          }
        }
        if ((char)local_458 == '\0') {
          if ((char)local_450 == '\0') {
            FVar11 = cmSystemTools::GetFileFormat(local_568._M_dataplus._M_p);
            this = &local_148;
            if (FVar11 != HEADER_FILE_FORMAT) {
              if (FVar11 != CXX_FILE_FORMAT) goto LAB_002f0a43;
              this = &local_128;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(this,(value_type *)local_418);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_108,(value_type *)local_418);
          }
        }
LAB_002f0a43:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != paVar1) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
        }
        if (local_418 != (undefined1  [8])&local_408) {
          operator_delete((void *)local_418,
                          CONCAT17(local_408._M_local_buf[7],
                                   CONCAT61(local_408._M_allocated_capacity._1_6_,
                                            local_408._M_local_buf[0])) + 1);
        }
        psVar12 = (string *)&psVar12->_M_string_length;
      } while (psVar12 != (string *)local_498._8_8_);
    }
    target = local_4a0;
    uVar28 = local_478._M_allocated_capacity;
    if (local_478._M_allocated_capacity != local_478._8_8_) {
      do {
        cmGeneratorTarget::AddSource(target,(string *)uVar28);
        uVar28 = uVar28 + 0x20;
      } while (uVar28 != local_478._8_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_478);
    if ((string *)local_498._0_8_ != (string *)0x0) {
      operator_delete((void *)local_498._0_8_,
                      CONCAT17(local_498[0x17],CONCAT61(local_498._17_6_,local_498[0x10])) -
                      local_498._0_8_);
    }
  }
  local_418 = (undefined1  [8])&local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"_cpp_files","");
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_508,&local_128,";");
  cmOutputConverter::EscapeForCMake(&local_568,&local_508);
  cmMakefile::AddDefinition(local_4a8,(string *)local_418,local_568._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,
                    CONCAT17(local_508.field_2._M_local_buf[7],
                             CONCAT43(local_508.field_2._M_allocated_capacity._3_4_,
                                      CONCAT21(local_508.field_2._M_allocated_capacity._1_2_,
                                               local_508.field_2._M_local_buf[0]))) + 1);
  }
  if (local_418 != (undefined1  [8])&local_408) {
    operator_delete((void *)local_418,
                    CONCAT17(local_408._M_local_buf[7],
                             CONCAT61(local_408._M_allocated_capacity._1_6_,
                                      local_408._M_local_buf[0])) + 1);
  }
  local_418 = (undefined1  [8])&local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"AUTOMOC","");
  bVar7 = cmGeneratorTarget::GetPropertyAsBool(target,(string *)local_418);
  if (local_418 != (undefined1  [8])&local_408) {
    operator_delete((void *)local_418,
                    CONCAT17(local_408._M_local_buf[7],
                             CONCAT61(local_408._M_allocated_capacity._1_6_,
                                      local_408._M_local_buf[0])) + 1);
  }
  if (bVar7) {
    pcVar18 = (cmMakefile *)cmGeneratorTarget::GetLocalGenerator(target);
    pcVar5 = target->Target->Makefile;
    local_418 = (undefined1  [8])&local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"AUTOMOC_MOC_OPTIONS","");
    pcVar16 = cmGeneratorTarget::GetProperty(target,(string *)local_418);
    local_450 = pcVar18;
    if (local_418 != (undefined1  [8])&local_408) {
      operator_delete((void *)local_418,
                      CONCAT17(local_408._M_local_buf[7],
                               CONCAT61(local_408._M_allocated_capacity._1_6_,
                                        local_408._M_local_buf[0])) + 1);
    }
    pcVar13 = "";
    if (pcVar16 != (char *)0x0) {
      pcVar13 = pcVar16;
    }
    local_418 = (undefined1  [8])&local_408;
    sVar19 = strlen(pcVar13);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,pcVar13,pcVar13 + sVar19);
    local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
    local_568.field_2._M_allocated_capacity = 0x74706f5f636f6d5f;
    local_568.field_2._8_4_ = 0x736e6f69;
    local_568._M_string_length = 0xc;
    local_568.field_2._M_local_buf[0xc] = '\0';
    cmOutputConverter::EscapeForCMake(&local_508,(string *)local_418);
    cmMakefile::AddDefinition(pcVar5,&local_568,local_508._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,
                      CONCAT17(local_508.field_2._M_local_buf[7],
                               CONCAT43(local_508.field_2._M_allocated_capacity._3_4_,
                                        CONCAT21(local_508.field_2._M_allocated_capacity._1_2_,
                                                 local_508.field_2._M_local_buf[0]))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
    }
    local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
    local_568.field_2._M_allocated_capacity = 0x6f6d5f70696b735f;
    local_568.field_2._8_2_ = 99;
    local_568._M_string_length = 9;
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_4c8,&local_108,";");
    cmOutputConverter::EscapeForCMake(&local_508,&local_4c8);
    cmMakefile::AddDefinition(pcVar5,&local_568,local_508._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,
                      CONCAT17(local_508.field_2._M_local_buf[7],
                               CONCAT43(local_508.field_2._M_allocated_capacity._3_4_,
                                        CONCAT21(local_508.field_2._M_allocated_capacity._1_2_,
                                                 local_508.field_2._M_local_buf[0]))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,
                      (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
    }
    local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
    local_568.field_2._M_allocated_capacity = 0x6165685f636f6d5f;
    local_568.field_2._8_4_ = 0x73726564;
    local_568._M_string_length = 0xc;
    local_568.field_2._M_local_buf[0xc] = '\0';
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_4c8,&local_148,";");
    cmOutputConverter::EscapeForCMake(&local_508,&local_4c8);
    cmMakefile::AddDefinition(pcVar5,&local_568,local_508._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,
                      CONCAT17(local_508.field_2._M_local_buf[7],
                               CONCAT43(local_508.field_2._M_allocated_capacity._3_4_,
                                        CONCAT21(local_508.field_2._M_allocated_capacity._1_2_,
                                                 local_508.field_2._M_local_buf[0]))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,
                      (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
    }
    local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
    local_508._M_dataplus._M_p = (pointer)0x1a;
    local_568._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_568,(ulong)&local_508);
    local_568.field_2._M_allocated_capacity = (size_type)local_508._M_dataplus._M_p;
    builtin_strncpy(local_568._M_dataplus._M_p,"CMAKE_AUTOMOC_RELAXED_MODE",0x1a);
    local_568._M_string_length = (size_type)local_508._M_dataplus._M_p;
    local_568._M_dataplus._M_p[(long)local_508._M_dataplus._M_p] = '\0';
    bVar7 = cmMakefile::IsOn(pcVar5,&local_568);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
    }
    local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
    local_508._M_dataplus._M_p = (pointer)0x11;
    local_568._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_568,(ulong)&local_508);
    local_568.field_2._M_allocated_capacity = (size_type)local_508._M_dataplus._M_p;
    builtin_strncpy(local_568._M_dataplus._M_p,"_moc_relaxed_mode",0x11);
    local_568._M_string_length = (size_type)local_508._M_dataplus._M_p;
    local_568._M_dataplus._M_p[(long)local_508._M_dataplus._M_p] = '\0';
    pcVar16 = "FALSE";
    if (bVar7) {
      pcVar16 = "TRUE";
    }
    cmMakefile::AddDefinition(pcVar5,&local_568,pcVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
    }
    local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
    local_568._M_string_length = 0;
    local_568.field_2._M_allocated_capacity =
         local_568.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    local_508._M_string_length = 0;
    local_508.field_2._M_local_buf[0] = '\0';
    local_498[0x10] = '\0';
    local_498._17_6_ = 0;
    local_498[0x17] = '\0';
    local_498._0_8_ = (string *)0x0;
    local_498._8_8_ = (string *)0x0;
    cmMakefile::GetConfigurations
              (&local_4c8,pcVar5,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_498,true);
    GetCompileDefinitionsAndDirectories(target,&local_4c8,&local_568,&local_508);
    paVar1 = &local_4e8.field_2;
    local_4e8.field_2._M_allocated_capacity = 0x636e695f636f6d5f;
    local_4e8.field_2._8_2_ = 0x73;
    local_4e8._M_string_length = 9;
    local_4e8._M_dataplus._M_p = (pointer)paVar1;
    cmOutputConverter::EscapeForCMake(&local_528,&local_568);
    cmMakefile::AddDefinition(pcVar5,&local_4e8,local_528._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != &local_528.field_2) {
      operator_delete(local_528._M_dataplus._M_p,
                      (ulong)(local_528.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
    }
    local_528._M_dataplus._M_p = (char *)0x11;
    local_4e8._M_dataplus._M_p = (pointer)paVar1;
    local_4e8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_4e8,(ulong)&local_528);
    local_4e8.field_2._M_allocated_capacity = (size_type)local_528._M_dataplus._M_p;
    builtin_strncpy(local_4e8._M_dataplus._M_p,"_moc_compile_defs",0x11);
    local_4e8._M_string_length = (size_type)local_528._M_dataplus._M_p;
    local_4e8._M_dataplus._M_p[(long)local_528._M_dataplus._M_p] = '\0';
    cmOutputConverter::EscapeForCMake(&local_528,&local_508);
    cmMakefile::AddDefinition(pcVar5,&local_4e8,local_528._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != &local_528.field_2) {
      operator_delete(local_528._M_dataplus._M_p,
                      (ulong)(local_528.field_2._M_allocated_capacity + 1));
    }
    local_458 = pcVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4e8._M_dataplus._M_p,
                      (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
    }
    if (local_498._0_8_ != local_498._8_8_) {
      psVar12 = (string *)local_498._0_8_;
      do {
        local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
        local_4e8._M_string_length = 0;
        local_4e8.field_2._M_allocated_capacity =
             local_4e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
        local_528._M_string_length = 0;
        local_528.field_2._M_allocated_capacity =
             local_528.field_2._M_allocated_capacity & 0xffffffffffffff00;
        GetCompileDefinitionsAndDirectories(local_4a0,psVar12,&local_4e8,&local_528);
        if ((local_4e8._M_string_length != local_568._M_string_length) ||
           (((char *)local_4e8._M_string_length != (char *)0x0 &&
            (iVar10 = bcmp(local_4e8._M_dataplus._M_p,local_568._M_dataplus._M_p,
                           local_4e8._M_string_length), iVar10 != 0)))) {
          cmOutputConverter::EscapeForCMake(&local_548,&local_4e8);
          pmVar20 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_1d8,psVar12);
          std::__cxx11::string::operator=((string *)pmVar20,(string *)&local_548);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
            operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
          }
          if ((char *)local_568._M_string_length == (char *)0x0) {
            std::__cxx11::string::_M_assign((string *)&local_568);
          }
        }
        if ((local_528._M_string_length != local_508._M_string_length) ||
           (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_528._M_string_length !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0 &&
            (iVar10 = bcmp(local_528._M_dataplus._M_p,local_508._M_dataplus._M_p,
                           local_528._M_string_length), iVar10 != 0)))) {
          cmOutputConverter::EscapeForCMake(&local_548,&local_528);
          pmVar20 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_60,psVar12);
          std::__cxx11::string::operator=((string *)pmVar20,(string *)&local_548);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
            operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
          }
          if ((char *)local_508._M_string_length == (char *)0x0) {
            std::__cxx11::string::_M_assign((string *)&local_508);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,
                          (ulong)(local_528.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,
                          (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
        }
        psVar12 = psVar12 + 1;
      } while (psVar12 != (string *)local_498._8_8_);
    }
    paVar1 = &local_4e8.field_2;
    local_528._M_dataplus._M_p = (pointer)0x12;
    local_4e8._M_dataplus._M_p = (pointer)paVar1;
    local_4e8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_4e8,(ulong)&local_528);
    pcVar5 = local_458;
    local_4e8.field_2._M_allocated_capacity = (size_type)local_528._M_dataplus._M_p;
    *(undefined8 *)local_4e8._M_dataplus._M_p = 0x5f7465677261745f;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p + 8) = 'q';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p + 9) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p + 10) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p + 0xb) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p + 0xc) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p + 0xd) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p + 0xe) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p + 0xf) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p + 0x10) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p + 0x11) = 'n';
    local_4e8._M_string_length = (size_type)local_528._M_dataplus._M_p;
    local_4e8._M_dataplus._M_p[(long)local_528._M_dataplus._M_p] = '\0';
    pcVar16 = cmMakefile::GetDefinition(local_458,&local_4e8);
    target = local_4a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4e8._M_dataplus._M_p,
                      (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
    }
    iVar10 = strcmp(pcVar16,"5");
    if (iVar10 == 0) {
      local_4e8.field_2._M_allocated_capacity = 0x636f6d3a3a357451;
      local_4e8._M_string_length = 8;
      local_4e8.field_2._8_2_ = local_4e8.field_2._8_2_ & 0xff00;
      local_4e8._M_dataplus._M_p = (pointer)paVar1;
      pcVar21 = cmLocalGenerator::FindGeneratorTargetToUse((cmLocalGenerator *)local_450,&local_4e8)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_4e8._M_dataplus._M_p,
                        (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
      }
      if (pcVar21 == (cmGeneratorTarget *)0x0) {
        cmSystemTools::Error
                  ("Qt5::moc target not found ",local_168._M_dataplus._M_p,(char *)0x0,(char *)0x0);
      }
      else {
        local_528._M_dataplus._M_p = (pointer)0x12;
        local_4e8._M_dataplus._M_p = (pointer)paVar1;
        local_4e8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_4e8,(ulong)&local_528);
        local_4e8.field_2._M_allocated_capacity = (size_type)local_528._M_dataplus._M_p;
        *(undefined8 *)local_4e8._M_dataplus._M_p = 0x5f636f6d5f74715f;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p + 8) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p + 9) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p + 10) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p + 0xb) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p + 0xc) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p + 0xd) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p + 0xe) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p + 0xf) = 'b';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p + 0x10) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p + 0x11) = 'e';
        local_4e8._M_string_length = (size_type)local_528._M_dataplus._M_p;
        local_4e8._M_dataplus._M_p[(long)local_528._M_dataplus._M_p] = '\0';
        local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
        local_528._M_string_length = 0;
        local_528.field_2._M_allocated_capacity =
             local_528.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pcVar16 = cmGeneratorTarget::ImportedGetLocation(pcVar21,&local_528);
        cmMakefile::AddDefinition(pcVar5,&local_4e8,pcVar16);
LAB_002f1603:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,
                          (ulong)(local_528.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_4e8._M_dataplus._M_p,
                          (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
        }
      }
    }
    else {
      iVar10 = strcmp(pcVar16,"4");
      if (iVar10 == 0) {
        local_4e8.field_2._M_allocated_capacity = 0x636f6d3a3a347451;
        local_4e8._M_string_length = 8;
        local_4e8.field_2._8_2_ = local_4e8.field_2._8_2_ & 0xff00;
        local_4e8._M_dataplus._M_p = (pointer)paVar1;
        pcVar21 = cmLocalGenerator::FindGeneratorTargetToUse
                            ((cmLocalGenerator *)local_450,&local_4e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_4e8._M_dataplus._M_p,
                          (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
        }
        if (pcVar21 != (cmGeneratorTarget *)0x0) {
          local_528._M_dataplus._M_p = (pointer)0x12;
          local_4e8._M_dataplus._M_p = (pointer)paVar1;
          local_4e8._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_4e8,(ulong)&local_528);
          local_4e8.field_2._M_allocated_capacity = (size_type)local_528._M_dataplus._M_p;
          *(undefined8 *)local_4e8._M_dataplus._M_p = 0x5f636f6d5f74715f;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._M_dataplus._M_p + 8) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._M_dataplus._M_p + 9) = 'x';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._M_dataplus._M_p + 10) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._M_dataplus._M_p + 0xb) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._M_dataplus._M_p + 0xc) = 'u';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._M_dataplus._M_p + 0xd) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._M_dataplus._M_p + 0xe) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._M_dataplus._M_p + 0xf) = 'b';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._M_dataplus._M_p + 0x10) = 'l';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._M_dataplus._M_p + 0x11) = 'e';
          local_4e8._M_string_length = (size_type)local_528._M_dataplus._M_p;
          local_4e8._M_dataplus._M_p[(long)local_528._M_dataplus._M_p] = '\0';
          local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
          local_528._M_string_length = 0;
          local_528.field_2._M_allocated_capacity =
               local_528.field_2._M_allocated_capacity & 0xffffffffffffff00;
          pcVar16 = cmGeneratorTarget::ImportedGetLocation(pcVar21,&local_528);
          cmMakefile::AddDefinition(pcVar5,&local_4e8,pcVar16);
          goto LAB_002f1603;
        }
        cmSystemTools::Error
                  ("Qt4::moc target not found ",local_168._M_dataplus._M_p,(char *)0x0,(char *)0x0);
      }
      else {
        cmSystemTools::Error
                  ("The CMAKE_AUTOMOC feature supports only Qt 4 and Qt 5 ",
                   local_168._M_dataplus._M_p,(char *)0x0,(char *)0x0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,
                      (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,
                      CONCAT17(local_508.field_2._M_local_buf[7],
                               CONCAT43(local_508.field_2._M_allocated_capacity._3_4_,
                                        CONCAT21(local_508.field_2._M_allocated_capacity._1_2_,
                                                 local_508.field_2._M_local_buf[0]))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
    }
    if (local_418 != (undefined1  [8])&local_408) {
      operator_delete((void *)local_418,
                      CONCAT17(local_408._M_local_buf[7],
                               CONCAT61(local_408._M_allocated_capacity._1_6_,
                                        local_408._M_local_buf[0])) + 1);
    }
  }
  local_418 = (undefined1  [8])&local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"AUTOUIC","");
  bVar7 = cmGeneratorTarget::GetPropertyAsBool(target,(string *)local_418);
  if (local_418 != (undefined1  [8])&local_408) {
    operator_delete((void *)local_418,
                    CONCAT17(local_408._M_local_buf[7],
                             CONCAT61(local_408._M_allocated_capacity._1_6_,
                                      local_408._M_local_buf[0])) + 1);
  }
  if (!bVar7) goto LAB_002f221d;
  local_440 = (cmMakefile *)cmGeneratorTarget::GetLocalGenerator(target);
  pbVar29 = local_188.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pcVar5 = target->Target->Makefile;
  local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((ulong)local_410 & 0xffffffff00000000);
  local_408._M_local_buf[0] = '\0';
  local_408._M_allocated_capacity._1_6_ = 0;
  local_408._M_local_buf[7] = '\0';
  local_408._8_2_ = SUB82((_Base_ptr)&local_410,0);
  local_408._M_local_buf[10] = (char)((ulong)&local_410 >> 0x10);
  local_408._M_local_buf[0xb] = (char)((ulong)&local_410 >> 0x18);
  local_408._M_local_buf[0xc] = (char)((ulong)&local_410 >> 0x20);
  local_408._13_2_ = (undefined2)((ulong)&local_410 >> 0x28);
  local_408._M_local_buf[0xf] = (char)((ulong)&local_410 >> 0x38);
  local_3f0 = 0;
  local_3f8 = (_Base_ptr)&local_410;
  if (local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __v = local_188.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    local_568._M_dataplus._M_p = (pointer)local_418;
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_418,(_Base_ptr)&local_410,__v,(_Alloc_node *)&local_568);
      __v = __v + 1;
    } while (__v != pbVar29);
  }
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  local_568.field_2._M_allocated_capacity = 0x69755f70696b735f;
  local_568.field_2._8_2_ = 99;
  local_568._M_string_length = 9;
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_4c8,&local_188,";");
  cmOutputConverter::EscapeForCMake(&local_508,&local_4c8);
  pcVar21 = local_4a0;
  cmMakefile::AddDefinition(pcVar5,&local_568,local_508._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,
                    CONCAT17(local_508.field_2._M_local_buf[7],
                             CONCAT43(local_508.field_2._M_allocated_capacity._3_4_,
                                      CONCAT21(local_508.field_2._M_allocated_capacity._1_2_,
                                               local_508.field_2._M_local_buf[0]))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,(ulong)(local_4c8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  cmMakefile::GetQtUiFilesWithOptions
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_478,pcVar5);
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  local_508._M_dataplus._M_p = (pointer)0x12;
  local_568._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_568,(ulong)&local_508);
  local_568.field_2._M_allocated_capacity = (size_type)local_508._M_dataplus._M_p;
  builtin_strncpy(local_568._M_dataplus._M_p,"_target_qt_version",0x12);
  local_568._M_string_length = (size_type)local_508._M_dataplus._M_p;
  local_568._M_dataplus._M_p[(long)local_508._M_dataplus._M_p] = '\0';
  local_458 = (cmMakefile *)cmMakefile::GetDefinition(pcVar5,&local_568);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,(ulong)(local_568.field_2._M_allocated_capacity + 1))
    ;
  }
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  local_568._M_string_length = 0;
  local_568.field_2._M_allocated_capacity =
       local_568.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cmMakefile::GetConfigurations
            (&local_508,pcVar5,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8,true);
  GetUicOpts(pcVar21,&local_508,&local_568);
  if ((char *)local_568._M_string_length != (char *)0x0) {
    cmOutputConverter::EscapeForCMake(&local_4c8,&local_568);
    std::__cxx11::string::operator=((string *)&local_568,(string *)&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,
                      (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
    }
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    local_4e8._M_dataplus._M_p = (pointer)0x13;
    local_4c8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_4c8,(ulong)&local_4e8);
    local_4c8.field_2._M_allocated_capacity = (size_type)local_4e8._M_dataplus._M_p;
    builtin_strncpy(local_4c8._M_dataplus._M_p,"_uic_target_options",0x13);
    local_4c8._M_string_length = (size_type)local_4e8._M_dataplus._M_p;
    local_4c8._M_dataplus._M_p[(long)local_4e8._M_dataplus._M_p] = '\0';
    cmMakefile::AddDefinition(pcVar5,&local_4c8,local_568._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,
                      (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
    }
  }
  local_450 = pcVar5;
  if (local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar12 = (string *)
              local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      local_4c8._M_string_length = 0;
      local_4c8.field_2._M_allocated_capacity =
           local_4c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      GetUicOpts(local_4a0,psVar12,&local_4c8);
      if ((local_4c8._M_string_length != local_568._M_string_length) ||
         (((char *)local_4c8._M_string_length != (char *)0x0 &&
          (iVar10 = bcmp(local_4c8._M_dataplus._M_p,local_568._M_dataplus._M_p,
                         local_4c8._M_string_length), iVar10 != 0)))) {
        cmOutputConverter::EscapeForCMake(&local_4e8,&local_4c8);
        pmVar20 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_90,psVar12);
        std::__cxx11::string::operator=((string *)pmVar20,(string *)&local_4e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,
                          (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
        }
        if ((char *)local_568._M_string_length == (char *)0x0) {
          std::__cxx11::string::_M_assign((string *)&local_568);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,
                        (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
      }
      psVar12 = psVar12 + 1;
    } while (psVar12 !=
             (string *)
             local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  local_4c8._M_string_length = 0;
  local_4c8.field_2._M_allocated_capacity =
       local_4c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  local_4e8._M_string_length = 0;
  local_4e8.field_2._M_allocated_capacity =
       local_4e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (local_478._M_allocated_capacity != local_478._8_8_) {
    uVar28 = local_478._M_allocated_capacity;
    do {
      pcVar3 = *(cmSourceFile **)uVar28;
      psVar12 = cmSourceFile::GetFullPath(pcVar3,(string *)0x0);
      cmsys::SystemTools::GetRealPath(&local_528,psVar12,(string *)0x0);
      pVar31 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)local_418,&local_528);
      if (((undefined1  [16])pVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::__cxx11::string::append((char *)&local_4c8);
        std::__cxx11::string::_M_append((char *)&local_4c8,(ulong)local_528._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_4e8);
        local_498._24_7_ = 0x534e4f4954504f;
        local_498[0x10] = 'A';
        local_498._17_6_ = 0x4349554f5455;
        local_498[0x17] = '_';
        local_498._8_8_ = (string *)0xf;
        local_498[0x1f] = '\0';
        local_498._0_8_ = (string *)(local_498 + 0x10);
        pcVar16 = cmSourceFile::GetProperty(pcVar3,(string *)local_498);
        std::__cxx11::string::string((string *)&local_548,pcVar16,(allocator *)&local_438);
        if ((string *)local_498._0_8_ != (string *)(local_498 + 0x10)) {
          operator_delete((void *)local_498._0_8_,
                          CONCAT17(local_498[0x17],CONCAT61(local_498._17_6_,local_498[0x10])) + 1);
        }
        cmsys::SystemTools::ReplaceString(&local_548,";","@list_sep@");
        std::__cxx11::string::_M_append((char *)&local_4e8,(ulong)local_548._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
        local_448 = ";";
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_dataplus._M_p != &local_528.field_2) {
        operator_delete(local_528._M_dataplus._M_p,
                        (ulong)(local_528.field_2._M_allocated_capacity + 1));
      }
      uVar28 = uVar28 + 8;
    } while (uVar28 != local_478._8_8_);
  }
  paVar1 = &local_528.field_2;
  local_548._M_dataplus._M_p = (char *)0x15;
  local_528._M_dataplus._M_p = (pointer)paVar1;
  local_528._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_528,(ulong)&local_548);
  local_528.field_2._M_allocated_capacity = (size_type)local_548._M_dataplus._M_p;
  builtin_strncpy(local_528._M_dataplus._M_p,"_qt_uic_options_files",0x15);
  local_528._M_string_length = (size_type)local_548._M_dataplus._M_p;
  local_528._M_dataplus._M_p[(long)local_548._M_dataplus._M_p] = '\0';
  cmOutputConverter::EscapeForCMake(&local_548,&local_4c8);
  pcVar18 = local_450;
  pcVar5 = local_458;
  target = local_4a0;
  cmMakefile::AddDefinition(local_450,&local_528,local_548._M_dataplus._M_p);
  paVar2 = &local_548.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != paVar2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != paVar1) {
    operator_delete(local_528._M_dataplus._M_p,(ulong)(local_528.field_2._M_allocated_capacity + 1))
    ;
  }
  local_548._M_dataplus._M_p = (pointer)0x17;
  local_528._M_dataplus._M_p = (pointer)paVar1;
  local_528._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_528,(ulong)&local_548);
  local_528.field_2._M_allocated_capacity = (size_type)local_548._M_dataplus._M_p;
  builtin_strncpy(local_528._M_dataplus._M_p,"_qt_uic_options_options",0x17);
  local_528._M_string_length = (size_type)local_548._M_dataplus._M_p;
  local_528._M_dataplus._M_p[(long)local_548._M_dataplus._M_p] = '\0';
  cmOutputConverter::EscapeForCMake(&local_548,&local_4e8);
  cmMakefile::AddDefinition(pcVar18,&local_528,local_548._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != paVar2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != paVar1) {
    operator_delete(local_528._M_dataplus._M_p,(ulong)(local_528.field_2._M_allocated_capacity + 1))
    ;
  }
  psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  pcVar4 = (psVar12->_M_dataplus)._M_p;
  local_528._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_528,pcVar4,pcVar4 + psVar12->_M_string_length);
  iVar10 = strcmp((char *)pcVar5,"5");
  if (iVar10 == 0) {
    local_548.field_2._M_allocated_capacity = 0x6369753a3a357451;
    local_548._M_string_length = 8;
    local_548.field_2._M_local_buf[8] = '\0';
    local_548._M_dataplus._M_p = (pointer)paVar2;
    pcVar21 = cmLocalGenerator::FindGeneratorTargetToUse((cmLocalGenerator *)local_440,&local_548);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != paVar2) {
      operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
    }
    if (pcVar21 != (cmGeneratorTarget *)0x0) {
      local_498._0_8_ = (pointer)0x12;
      local_548._M_dataplus._M_p = (pointer)paVar2;
      local_548._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_548,(ulong)local_498);
      local_548.field_2._M_allocated_capacity = local_498._0_8_;
      *(undefined8 *)local_548._M_dataplus._M_p = 0x5f6369755f74715f;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p + 8) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p + 9) = 'x';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p + 10) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p + 0xb) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p + 0xc) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p + 0xd) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p + 0xe) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p + 0xf) = 'b';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p + 0x10) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p + 0x11) = 'e';
      local_548._M_string_length = local_498._0_8_;
      local_548._M_dataplus._M_p[local_498._0_8_] = '\0';
      local_498._8_8_ = (string *)0x0;
      local_498[0x10] = '\0';
      local_498._0_8_ = (string *)(local_498 + 0x10);
      pcVar16 = cmGeneratorTarget::ImportedGetLocation(pcVar21,(string *)local_498);
      cmMakefile::AddDefinition(pcVar18,&local_548,pcVar16);
LAB_002f20f4:
      if ((string *)local_498._0_8_ != (string *)(local_498 + 0x10)) {
        operator_delete((void *)local_498._0_8_,
                        CONCAT17(local_498[0x17],CONCAT61(local_498._17_6_,local_498[0x10])) + 1);
      }
      target = local_4a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != paVar2) {
        operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    iVar10 = strcmp((char *)pcVar5,"4");
    if (iVar10 == 0) {
      local_548.field_2._M_allocated_capacity = 0x6369753a3a347451;
      local_548._M_string_length = 8;
      local_548.field_2._M_local_buf[8] = '\0';
      local_548._M_dataplus._M_p = (pointer)paVar2;
      pcVar21 = cmLocalGenerator::FindGeneratorTargetToUse((cmLocalGenerator *)local_440,&local_548)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != paVar2) {
        operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
      }
      if (pcVar21 != (cmGeneratorTarget *)0x0) {
        local_498._0_8_ = (pointer)0x12;
        local_548._M_dataplus._M_p = (pointer)paVar2;
        local_548._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_548,(ulong)local_498);
        local_548.field_2._M_allocated_capacity = local_498._0_8_;
        *(undefined8 *)local_548._M_dataplus._M_p = 0x5f6369755f74715f;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p + 8) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p + 9) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p + 10) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p + 0xb) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p + 0xc) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p + 0xd) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p + 0xe) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p + 0xf) = 'b';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p + 0x10) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p + 0x11) = 'e';
        local_548._M_string_length = local_498._0_8_;
        local_548._M_dataplus._M_p[local_498._0_8_] = '\0';
        local_498._8_8_ = (string *)0x0;
        local_498[0x10] = '\0';
        local_498._0_8_ = (string *)(local_498 + 0x10);
        pcVar16 = cmGeneratorTarget::ImportedGetLocation(pcVar21,(string *)local_498);
        cmMakefile::AddDefinition(pcVar18,&local_548,pcVar16);
        goto LAB_002f20f4;
      }
      cmSystemTools::Error
                ("Qt4::uic target not found ",local_528._M_dataplus._M_p,(char *)0x0,(char *)0x0);
    }
    else {
      cmSystemTools::Error
                ("The CMAKE_AUTOUIC feature supports only Qt 4 and Qt 5 ",local_528._M_dataplus._M_p
                 ,(char *)0x0,(char *)0x0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != paVar1) {
    operator_delete(local_528._M_dataplus._M_p,(ulong)(local_528.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,(ulong)(local_4e8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,(ulong)(local_4c8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,
                    CONCAT17(local_508.field_2._M_local_buf[7],
                             CONCAT43(local_508.field_2._M_allocated_capacity._3_4_,
                                      CONCAT21(local_508.field_2._M_allocated_capacity._1_2_,
                                               local_508.field_2._M_local_buf[0]))) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_allocated_capacity !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_478._M_allocated_capacity,
                    local_468._M_allocated_capacity - local_478._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_418);
LAB_002f221d:
  local_418 = (undefined1  [8])&local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"AUTORCC","");
  bVar7 = cmGeneratorTarget::GetPropertyAsBool(target,(string *)local_418);
  if (local_418 != (undefined1  [8])&local_408) {
    operator_delete((void *)local_418,
                    CONCAT17(local_408._M_local_buf[7],
                             CONCAT61(local_408._M_allocated_capacity._1_6_,
                                      local_408._M_local_buf[0])) + 1);
  }
  if (bVar7) {
    local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
    local_568._M_string_length = 0;
    local_568.field_2._M_allocated_capacity =
         local_568.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pcVar5 = target->Target->Makefile;
    local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    cmGeneratorTarget::GetConfigCommonSourceFiles(target,&local_1f8);
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    local_508._M_string_length = 0;
    local_508.field_2._M_local_buf[0] = '\0';
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    local_4c8._M_string_length = 0;
    local_4c8.field_2._M_allocated_capacity =
         local_4c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
    local_4e8._M_string_length = 0;
    local_4e8.field_2._M_allocated_capacity =
         local_4e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_418 = (undefined1  [8])&local_408;
    local_528._M_dataplus._M_p = (pointer)0x12;
    local_418 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_418,(ulong)&local_528);
    local_408._M_local_buf[0] = (char)local_528._M_dataplus._M_p;
    local_408._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_528._M_dataplus._M_p >> 8);
    local_408._M_local_buf[7] = (char)((ulong)local_528._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_418 = 0x5f7465677261745f;
    *(char *)((long)local_418 + 8) = 'q';
    *(char *)((long)local_418 + 9) = 't';
    *(char *)((long)local_418 + 10) = '_';
    *(char *)((long)local_418 + 0xb) = 'v';
    *(char *)((long)local_418 + 0xc) = 'e';
    *(char *)((long)local_418 + 0xd) = 'r';
    *(char *)((long)local_418 + 0xe) = 's';
    *(char *)((long)local_418 + 0xf) = 'i';
    *(char *)((long)local_418 + 0x10) = 'o';
    *(char *)((long)local_418 + 0x11) = 'n';
    local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_dataplus._M_p;
    *(char *)((long)local_418 + (long)local_528._M_dataplus._M_p) = '\0';
    cmMakefile::GetDefinition(pcVar5,(string *)local_418);
    if (local_418 != (undefined1  [8])&local_408) {
      operator_delete((void *)local_418,
                      CONCAT17(local_408._M_local_buf[7],
                               CONCAT61(local_408._M_allocated_capacity._1_6_,
                                        local_408._M_local_buf[0])) + 1);
    }
    local_438.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_438.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_438.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_408._M_local_buf[0] = 'A';
    local_408._M_allocated_capacity._1_6_ = 0x4343524f5455;
    local_408._M_local_buf[7] = '_';
    local_408._8_2_ = 0x504f;
    local_408._M_local_buf[10] = 'T';
    local_408._M_local_buf[0xb] = 'I';
    local_408._M_local_buf[0xc] = 'O';
    local_408._13_2_ = 0x534e;
    local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xf;
    local_408._M_local_buf[0xf] = '\0';
    local_418 = (undefined1  [8])&local_408;
    pcVar16 = cmGeneratorTarget::GetProperty(target,(string *)local_418);
    if (local_418 != (undefined1  [8])&local_408) {
      operator_delete((void *)local_418,
                      CONCAT17(local_408._M_local_buf[7],
                               CONCAT61(local_408._M_allocated_capacity._1_6_,
                                        local_408._M_local_buf[0])) + 1);
    }
    if (pcVar16 != (char *)0x0) {
      local_418 = (undefined1  [8])&local_408;
      sVar19 = strlen(pcVar16);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,pcVar16,pcVar16 + sVar19);
      cmSystemTools::ExpandListArgument((string *)local_418,&local_438,false);
      if (local_418 != (undefined1  [8])&local_408) {
        operator_delete((void *)local_418,
                        CONCAT17(local_408._M_local_buf[7],
                                 CONCAT61(local_408._M_allocated_capacity._1_6_,
                                          local_408._M_local_buf[0])) + 1);
      }
    }
    local_418 = (undefined1  [8])&local_408;
    local_548._M_dataplus._M_p = (pointer)0x10;
    local_418 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_418,(ulong)&local_548);
    local_408._M_local_buf[0] = (char)local_548._M_dataplus._M_p;
    local_408._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_548._M_dataplus._M_p >> 8);
    local_408._M_local_buf[7] = (char)((ulong)local_548._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_418 = 0x49535245565f5451;
    *(char *)((long)local_418 + 8) = 'O';
    *(char *)((long)local_418 + 9) = 'N';
    *(char *)((long)local_418 + 10) = '_';
    *(char *)((long)local_418 + 0xb) = 'M';
    *(char *)((long)local_418 + 0xc) = 'A';
    *(char *)((long)local_418 + 0xd) = 'J';
    *(char *)((long)local_418 + 0xe) = 'O';
    *(char *)((long)local_418 + 0xf) = 'R';
    local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p;
    *(char *)((long)local_418 + (long)local_548._M_dataplus._M_p) = '\0';
    pcVar16 = cmMakefile::GetSafeDefinition(pcVar5,(string *)local_418);
    std::__cxx11::string::string((string *)&local_528,pcVar16,(allocator *)&local_548);
    if (local_418 != (undefined1  [8])&local_408) {
      operator_delete((void *)local_418,
                      CONCAT17(local_408._M_local_buf[7],
                               CONCAT61(local_408._M_allocated_capacity._1_6_,
                                        local_408._M_local_buf[0])) + 1);
    }
    iVar10 = std::__cxx11::string::compare((char *)&local_528);
    if (iVar10 == 0) {
      local_418 = (undefined1  [8])&local_408;
      local_548._M_dataplus._M_p = (pointer)0x15;
      local_418 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_418,(ulong)&local_548);
      local_408._M_local_buf[0] = (char)local_548._M_dataplus._M_p;
      local_408._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_548._M_dataplus._M_p >> 8);
      local_408._M_local_buf[7] = (char)((ulong)local_548._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_418 = 0x5f65726f43357451;
      *(char *)((long)local_418 + 8) = 'V';
      *(char *)((long)local_418 + 9) = 'E';
      *(char *)((long)local_418 + 10) = 'R';
      *(char *)((long)local_418 + 0xb) = 'S';
      *(char *)((long)local_418 + 0xc) = 'I';
      *(char *)((long)local_418 + 0xd) = 'O';
      *(char *)((long)local_418 + 0xe) = 'N';
      *(char *)((long)local_418 + 0xf) = '_';
      *(char *)((long)local_418 + 0xd) = 'O';
      *(char *)((long)local_418 + 0xe) = 'N';
      *(char *)((long)local_418 + 0xf) = '_';
      *(char *)((long)local_418 + 0x10) = 'M';
      *(char *)((long)local_418 + 0x11) = 'A';
      *(char *)((long)local_418 + 0x12) = 'J';
      *(char *)((long)local_418 + 0x13) = 'O';
      *(char *)((long)local_418 + 0x14) = 'R';
      local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p;
      *(char *)((long)local_418 + (long)local_548._M_dataplus._M_p) = '\0';
      pcVar16 = cmMakefile::GetSafeDefinition(pcVar5,(string *)local_418);
      sVar6 = local_528._M_string_length;
      strlen(pcVar16);
      std::__cxx11::string::_M_replace((ulong)&local_528,0,(char *)sVar6,(ulong)pcVar16);
      if (local_418 != (undefined1  [8])&local_408) {
        operator_delete((void *)local_418,
                        CONCAT17(local_408._M_local_buf[7],
                                 CONCAT61(local_408._M_allocated_capacity._1_6_,
                                          local_408._M_local_buf[0])) + 1);
      }
    }
    local_450 = pcVar5;
    if (local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_448 = "";
      local_458 = (cmMakefile *)0x550243;
      psVar12 = (string *)
                local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar3 = (cmSourceFile *)(psVar12->_M_dataplus)._M_p;
        psVar15 = cmSourceFile::GetExtension_abi_cxx11_(pcVar3);
        local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
        pcVar4 = (psVar15->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_548,pcVar4,pcVar4 + psVar15->_M_string_length);
        iVar10 = std::__cxx11::string::compare((char *)&local_548);
        bVar7 = true;
        if (iVar10 == 0) {
          psVar15 = cmSourceFile::GetFullPath(pcVar3,(string *)0x0);
          cmsys::SystemTools::GetRealPath((string *)local_498,psVar15,(string *)0x0);
          local_418 = (undefined1  [8])&local_408;
          local_408._M_local_buf[0] = 'S';
          local_408._M_allocated_capacity._1_6_ = 0x55415f50494b;
          local_408._M_local_buf[7] = 'T';
          local_408._8_2_ = 0x524f;
          local_408._M_local_buf[10] = 'C';
          local_408._M_local_buf[0xb] = 'C';
          local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0xc;
          local_408._M_local_buf[0xc] = '\0';
          pcVar16 = cmSourceFile::GetPropertyForUser(pcVar3,(string *)local_418);
          bVar9 = cmSystemTools::IsOn(pcVar16);
          if (local_418 != (undefined1  [8])&local_408) {
            operator_delete((void *)local_418,
                            CONCAT17(local_408._M_local_buf[7],
                                     CONCAT61(local_408._M_allocated_capacity._1_6_,
                                              local_408._M_local_buf[0])) + 1);
          }
          bVar7 = true;
          if (!bVar9) {
            std::__cxx11::string::append((char *)&local_568);
            std::__cxx11::string::_M_append((char *)&local_568,local_498._0_8_);
            local_408._8_2_ = 0x504f;
            local_408._M_local_buf[10] = 'T';
            local_408._M_local_buf[0xb] = 'I';
            local_408._M_local_buf[0xc] = 'O';
            local_408._13_2_ = 0x534e;
            local_408._M_local_buf[0] = 'A';
            local_408._M_allocated_capacity._1_6_ = 0x4343524f5455;
            local_408._M_local_buf[7] = '_';
            local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0xf;
            local_408._M_local_buf[0xf] = '\0';
            local_418 = (undefined1  [8])&local_408;
            pcVar16 = cmSourceFile::GetProperty(pcVar3,(string *)local_418);
            if (local_418 != (undefined1  [8])&local_408) {
              operator_delete((void *)local_418,
                              CONCAT17(local_408._M_local_buf[7],
                                       CONCAT61(local_408._M_allocated_capacity._1_6_,
                                                local_408._M_local_buf[0])) + 1);
            }
            if (pcVar16 != (char *)0x0) {
              local_218.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
              local_218.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
              local_218.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_418 = (undefined1  [8])&local_408;
              sVar19 = strlen(pcVar16);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_418,pcVar16,pcVar16 + sVar19);
              cmSystemTools::ExpandListArgument((string *)local_418,&local_218,false);
              if (local_418 != (undefined1  [8])&local_408) {
                operator_delete((void *)local_418,
                                CONCAT17(local_408._M_local_buf[7],
                                         CONCAT61(local_408._M_allocated_capacity._1_6_,
                                                  local_408._M_local_buf[0])) + 1);
              }
              local_478._M_allocated_capacity = 0;
              local_478._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_468._M_allocated_capacity = 0;
              for (pbVar29 = local_218.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  pbVar29 !=
                  local_218.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar29 = pbVar29 + 1) {
                _Var22 = std::
                         __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                   (local_438.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    local_438.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,pbVar29);
                if (_Var22._M_current ==
                    local_438.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_478,pbVar29);
                }
                else {
                  local_418 = (undefined1  [8])&local_408;
                  pcVar4 = (pbVar29->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_418,pcVar4,pcVar4 + pbVar29->_M_string_length);
                  ppcVar23 = std::find_if<char_const*const*,cmStrCmp>
                                       ((char **)MergeRccOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                                                 ::valueOptions,cmCacheEntryTypes,
                                        (cmStrCmp *)local_418);
                  if (local_418 != (undefined1  [8])&local_408) {
                    operator_delete((void *)local_418,
                                    CONCAT17(local_408._M_local_buf[7],
                                             CONCAT61(local_408._M_allocated_capacity._1_6_,
                                                      local_408._M_local_buf[0])) + 1);
                  }
                  if (ppcVar23 != cmCacheEntryTypes) {
                    if (_Var22._M_current + 1 ==
                        local_438.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      __assert_fail("existingIt + 1 != opts.end()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmQtAutoGeneratorInitializer.cxx"
                                    ,0x1a7,
                                    "void MergeRccOptions(std::vector<std::string> &, const std::vector<std::string> &, bool)"
                                   );
                    }
                    pbVar29 = pbVar29 + 1;
                    std::__cxx11::string::_M_assign((string *)(_Var22._M_current + 1));
                  }
                }
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_438,
                         local_438.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,local_478._M_allocated_capacity)
              ;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_478);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_218);
            }
            if (local_438.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_438.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::string::append((char *)&local_4c8);
              std::__cxx11::string::_M_append((char *)&local_4c8,local_498._0_8_);
              std::__cxx11::string::append((char *)&local_4e8);
            }
            pbVar30 = local_438.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_438.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_438.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                std::__cxx11::string::append((char *)&local_4e8);
                std::__cxx11::string::_M_append
                          ((char *)&local_4e8,(ulong)(pbVar30->_M_dataplus)._M_p);
                pbVar30 = pbVar30 + 1;
              } while (pbVar30 !=
                       local_438.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            local_218.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
            local_218.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
            local_218.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_418 = (undefined1  [8])&local_408;
            local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
            local_408._M_local_buf[0] = '\0';
            local_478._M_allocated_capacity = (size_type)&local_468;
            local_468._M_allocated_capacity = 0x45544152454e4547;
            local_468._M_local_buf[8] = 'D';
            local_478._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x9;
            local_468._M_local_buf[9] = '\0';
            pcVar16 = cmSourceFile::GetPropertyForUser(pcVar3,(string *)&local_478);
            bVar7 = cmSystemTools::IsOn(pcVar16);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_478._M_allocated_capacity != &local_468) {
              operator_delete((void *)local_478._M_allocated_capacity,
                              local_468._M_allocated_capacity + 1);
            }
            if (bVar7) {
LAB_002f2b35:
              std::__cxx11::string::append((char *)&local_508);
              bVar7 = true;
              std::__cxx11::string::_M_append((char *)&local_508,(ulong)local_418);
              local_448 = ";";
            }
            else {
              iVar10 = std::__cxx11::string::compare((char *)&local_528);
              if (iVar10 == 0) {
                ListQt5RccInputs((string *)&local_478,pcVar3,local_4a0,&local_218);
              }
              else {
                ListQt4RccInputs((string *)&local_478,pcVar3,&local_218);
              }
              std::__cxx11::string::operator=((string *)local_418,(string *)local_478._M_local_buf);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_478._M_allocated_capacity != &local_468) {
                operator_delete((void *)local_478._M_allocated_capacity,
                                local_468._M_allocated_capacity + 1);
              }
              if (local_410 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) goto LAB_002f2b35;
              bVar7 = false;
            }
            if (local_418 != (undefined1  [8])&local_408) {
              operator_delete((void *)local_418,
                              CONCAT17(local_408._M_local_buf[7],
                                       CONCAT61(local_408._M_allocated_capacity._1_6_,
                                                local_408._M_local_buf[0])) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_218);
            local_458 = (cmMakefile *)0x50b17e;
          }
          if ((string *)local_498._0_8_ != (string *)(local_498 + 0x10)) {
            operator_delete((void *)local_498._0_8_,
                            CONCAT17(local_498[0x17],CONCAT61(local_498._17_6_,local_498[0x10])) + 1
                           );
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
        target = local_4a0;
        if (!bVar7) goto LAB_002f2f99;
        psVar12 = (string *)&psVar12->_M_string_length;
      } while (psVar12 !=
               (string *)
               local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                   "_qt_rcc_inputs_",psVar12);
    cmOutputConverter::EscapeForCMake(&local_548,&local_508);
    pcVar5 = local_450;
    cmMakefile::AddDefinition(local_450,(string *)local_418,local_548._M_dataplus._M_p);
    paVar1 = &local_548.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != paVar1) {
      operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
    }
    if (local_418 != (undefined1  [8])&local_408) {
      operator_delete((void *)local_418,
                      CONCAT17(local_408._M_local_buf[7],
                               CONCAT61(local_408._M_allocated_capacity._1_6_,
                                        local_408._M_local_buf[0])) + 1);
    }
    local_418 = (undefined1  [8])&local_408;
    local_408._M_local_buf[0] = '_';
    local_408._M_allocated_capacity._1_6_ = 0x69665f636372;
    local_408._M_local_buf[7] = 'l';
    local_408._8_2_ = 0x7365;
    local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xa;
    local_408._M_local_buf[10] = '\0';
    cmOutputConverter::EscapeForCMake(&local_548,&local_568);
    cmMakefile::AddDefinition(pcVar5,(string *)local_418,local_548._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != paVar1) {
      operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
    }
    if (local_418 != (undefined1  [8])&local_408) {
      operator_delete((void *)local_418,
                      CONCAT17(local_408._M_local_buf[7],
                               CONCAT61(local_408._M_allocated_capacity._1_6_,
                                        local_408._M_local_buf[0])) + 1);
    }
    local_418 = (undefined1  [8])&local_408;
    local_548._M_dataplus._M_p = (char *)0x15;
    local_418 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_418,(ulong)&local_548);
    local_408._M_local_buf[0] = (char)local_548._M_dataplus._M_p;
    local_408._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_548._M_dataplus._M_p >> 8);
    local_408._M_local_buf[7] = (char)((ulong)local_548._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_418 = 0x5f6363725f74715f;
    *(char *)((long)local_418 + 8) = 'o';
    *(char *)((long)local_418 + 9) = 'p';
    *(char *)((long)local_418 + 10) = 't';
    *(char *)((long)local_418 + 0xb) = 'i';
    *(char *)((long)local_418 + 0xc) = 'o';
    *(char *)((long)local_418 + 0xd) = 'n';
    *(char *)((long)local_418 + 0xe) = 's';
    *(char *)((long)local_418 + 0xf) = '_';
    *(char *)((long)local_418 + 0xd) = 'n';
    *(char *)((long)local_418 + 0xe) = 's';
    *(char *)((long)local_418 + 0xf) = '_';
    *(char *)((long)local_418 + 0x10) = 'f';
    *(char *)((long)local_418 + 0x11) = 'i';
    *(char *)((long)local_418 + 0x12) = 'l';
    *(char *)((long)local_418 + 0x13) = 'e';
    *(char *)((long)local_418 + 0x14) = 's';
    local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p;
    *(char *)((long)local_418 + (long)local_548._M_dataplus._M_p) = '\0';
    cmOutputConverter::EscapeForCMake(&local_548,&local_4c8);
    cmMakefile::AddDefinition(pcVar5,(string *)local_418,local_548._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != paVar1) {
      operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
    }
    if (local_418 != (undefined1  [8])&local_408) {
      operator_delete((void *)local_418,
                      CONCAT17(local_408._M_local_buf[7],
                               CONCAT61(local_408._M_allocated_capacity._1_6_,
                                        local_408._M_local_buf[0])) + 1);
    }
    local_418 = (undefined1  [8])&local_408;
    local_548._M_dataplus._M_p = (char *)0x17;
    local_418 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_418,(ulong)&local_548);
    local_408._M_local_buf[0] = (char)local_548._M_dataplus._M_p;
    local_408._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_548._M_dataplus._M_p >> 8);
    local_408._M_local_buf[7] = (char)((ulong)local_548._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_418 = 0x5f6363725f74715f;
    *(char *)((long)local_418 + 8) = 'o';
    *(char *)((long)local_418 + 9) = 'p';
    *(char *)((long)local_418 + 10) = 't';
    *(char *)((long)local_418 + 0xb) = 'i';
    *(char *)((long)local_418 + 0xc) = 'o';
    *(char *)((long)local_418 + 0xd) = 'n';
    *(char *)((long)local_418 + 0xe) = 's';
    *(char *)((long)local_418 + 0xf) = '_';
    *(char *)((long)local_418 + 0xf) = '_';
    *(char *)((long)local_418 + 0x10) = 'o';
    *(char *)((long)local_418 + 0x11) = 'p';
    *(char *)((long)local_418 + 0x12) = 't';
    *(char *)((long)local_418 + 0x13) = 'i';
    *(char *)((long)local_418 + 0x14) = 'o';
    *(char *)((long)local_418 + 0x15) = 'n';
    *(char *)((long)local_418 + 0x16) = 's';
    local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p;
    *(char *)((long)local_418 + (long)local_548._M_dataplus._M_p) = '\0';
    cmOutputConverter::EscapeForCMake(&local_548,&local_4e8);
    cmMakefile::AddDefinition(pcVar5,(string *)local_418,local_548._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != paVar1) {
      operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
    }
    if (local_418 != (undefined1  [8])&local_408) {
      operator_delete((void *)local_418,
                      CONCAT17(local_408._M_local_buf[7],
                               CONCAT61(local_408._M_allocated_capacity._1_6_,
                                        local_408._M_local_buf[0])) + 1);
    }
    local_418 = (undefined1  [8])&local_408;
    local_548._M_dataplus._M_p = (pointer)0x12;
    local_418 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_418,(ulong)&local_548);
    local_408._M_local_buf[0] = (char)local_548._M_dataplus._M_p;
    local_408._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_548._M_dataplus._M_p >> 8);
    local_408._M_local_buf[7] = (char)((ulong)local_548._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_418 = 0x5f6363725f74715f;
    *(char *)((long)local_418 + 8) = 'e';
    *(char *)((long)local_418 + 9) = 'x';
    *(char *)((long)local_418 + 10) = 'e';
    *(char *)((long)local_418 + 0xb) = 'c';
    *(char *)((long)local_418 + 0xc) = 'u';
    *(char *)((long)local_418 + 0xd) = 't';
    *(char *)((long)local_418 + 0xe) = 'a';
    *(char *)((long)local_418 + 0xf) = 'b';
    *(char *)((long)local_418 + 0x10) = 'l';
    *(char *)((long)local_418 + 0x11) = 'e';
    local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p;
    *(char *)((long)local_418 + (long)local_548._M_dataplus._M_p) = '\0';
    GetRccExecutable_abi_cxx11_(&local_548,target);
    cmMakefile::AddDefinition(pcVar5,(string *)local_418,local_548._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != paVar1) {
      operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
    }
    if (local_418 != (undefined1  [8])&local_408) {
      operator_delete((void *)local_418,
                      CONCAT17(local_408._M_local_buf[7],
                               CONCAT61(local_408._M_allocated_capacity._1_6_,
                                        local_408._M_local_buf[0])) + 1);
    }
LAB_002f2f99:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != &local_528.field_2) {
      operator_delete(local_528._M_dataplus._M_p,
                      (ulong)(local_528.field_2._M_allocated_capacity + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p,
                      (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,
                      (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,
                      CONCAT17(local_508.field_2._M_local_buf[7],
                               CONCAT43(local_508.field_2._M_allocated_capacity._3_4_,
                                        CONCAT21(local_508.field_2._M_allocated_capacity._1_2_,
                                                 local_508.field_2._M_local_buf[0]))) + 1);
    }
    if ((string *)
        local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (string *)0x0) {
      operator_delete(local_1f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
    }
  }
  local_418 = (undefined1  [8])&local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"CMAKE_ROOT","");
  pcVar16 = cmMakefile::GetSafeDefinition(local_4a8,(string *)local_418);
  if (local_418 != (undefined1  [8])&local_408) {
    operator_delete((void *)local_418,
                    CONCAT17(local_408._M_local_buf[7],
                             CONCAT61(local_408._M_allocated_capacity._1_6_,
                                      local_408._M_local_buf[0])) + 1);
  }
  std::__cxx11::string::string((string *)&local_568,pcVar16,(allocator *)local_418);
  std::__cxx11::string::append((char *)&local_568);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_508,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  std::__cxx11::string::append((char *)&local_508);
  local_418 = (undefined1  [8])&local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"_qt_rcc_inputs","");
  psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  std::operator+(&local_4c8,"_qt_rcc_inputs_",psVar12);
  pcVar5 = local_4a8;
  pcVar16 = cmMakefile::GetDefinition(local_4a8,&local_4c8);
  cmMakefile::AddDefinition(pcVar5,(string *)local_418,pcVar16);
  paVar1 = &local_4c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4c8._M_dataplus._M_p,(ulong)(local_4c8.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_418 != (undefined1  [8])&local_408) {
    operator_delete((void *)local_418,
                    CONCAT17(local_408._M_local_buf[7],
                             CONCAT61(local_408._M_allocated_capacity._1_6_,
                                      local_408._M_local_buf[0])) + 1);
  }
  outfile._M_p = local_508._M_dataplus._M_p;
  infile._M_p = local_568._M_dataplus._M_p;
  cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)local_418);
  cmMakefile::ConfigureFile
            (local_4a8,infile._M_p,outfile._M_p,false,true,false,(cmNewLineStyle *)local_418);
  local_4e8._M_dataplus._M_p = local_4e8._M_dataplus._M_p & 0xffffffff00000000;
  cmsys::SystemTools::GetPermissions(&local_508,(mode_t *)&local_4e8);
  if (-1 < (char)local_4e8._M_dataplus._M_p) {
    cmsys::SystemTools::SetPermissions(&local_508,(uint)local_4e8._M_dataplus._M_p | 0x80,false);
  }
  if (((local_60._M_impl.super__Rb_tree_header._M_node_count != 0) || (local_1b0 != 0)) ||
     (local_90._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    std::ofstream::ofstream(local_418,local_508._M_dataplus._M_p,_S_app);
    if ((*(byte *)((long)&local_3f8 + *(long *)((long)local_418 + -0x18)) & 5) == 0) {
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_60._M_impl.super__Rb_tree_header &&
          local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
        p_Var25 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_418,"set(AM_MOC_COMPILE_DEFINITIONS_",0x1f);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_418,*(char **)(p_Var25 + 1),
                               (long)p_Var25[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24," ",1);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar24,*(char **)(p_Var25 + 2),(long)p_Var25[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24,")\n",2);
          p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25);
        } while ((_Rb_tree_header *)p_Var25 != &local_60._M_impl.super__Rb_tree_header);
      }
      if ((_Rb_tree_node_base *)local_1d8._24_8_ != (_Rb_tree_node_base *)(local_1d8 + 8) &&
          local_1b0 != 0) {
        p_Var26 = (_Rb_tree_node_base *)local_1d8._24_8_;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_418,"set(AM_MOC_INCLUDES_",0x14);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_418,*(char **)(p_Var26 + 1),
                               (long)p_Var26[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24," ",1);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar24,*(char **)(p_Var26 + 2),(long)p_Var26[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24,")\n",2);
          p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26);
        } while (p_Var26 != (_Rb_tree_node_base *)(local_1d8 + 8));
      }
      if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_90._M_impl.super__Rb_tree_header &&
          local_90._M_impl.super__Rb_tree_header._M_node_count != 0) {
        p_Var25 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_418,"set(AM_UIC_TARGET_OPTIONS_",0x1a);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_418,*(char **)(p_Var25 + 1),
                               (long)p_Var25[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24," ",1);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar24,*(char **)(p_Var25 + 2),(long)p_Var25[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24,")\n",2);
          p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25);
        } while ((_Rb_tree_header *)p_Var25 != &local_90._M_impl.super__Rb_tree_header);
      }
    }
    else {
      local_4c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4c8,"Internal CMake error when trying to open file: ","");
      std::__cxx11::string::append((char *)&local_4c8);
      std::__cxx11::string::append((char *)&local_4c8);
      cmSystemTools::Error(local_4c8._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_4c8._M_dataplus._M_p,
                        (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
      }
    }
    local_418 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_418 + *(long *)(_VTT->_M_local_buf + -0x18)) = __M_insert<void_const*>;
    std::filebuf::~filebuf((filebuf *)&local_410);
    std::ios_base::~ios_base(local_320);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,
                    CONCAT17(local_508.field_2._M_local_buf[7],
                             CONCAT43(local_508.field_2._M_allocated_capacity._3_4_,
                                      CONCAT21(local_508.field_2._M_allocated_capacity._1_2_,
                                               local_508.field_2._M_local_buf[0]))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  cmMakefile::PopScope(local_4a8);
  return;
}

Assistant:

void cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(
    cmGeneratorTarget const* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();

  // forget the variables added here afterwards again:
  cmMakefile::ScopePushPop varScope(makefile);
  static_cast<void>(varScope);

  // create a custom target for running generators at buildtime:
  std::string autogenTargetName = GetAutogenTargetName(target);

  makefile->AddDefinition("_moc_target_name",
          cmOutputConverter::EscapeForCMake(autogenTargetName).c_str());
  makefile->AddDefinition("_origin_target_name",
          cmOutputConverter::EscapeForCMake(target->GetName()).c_str());

  std::string targetDir = GetAutogenTargetDir(target);

  const char *qtVersion = makefile->GetDefinition("Qt5Core_VERSION_MAJOR");
  if (!qtVersion)
    {
    qtVersion = makefile->GetDefinition("QT_VERSION_MAJOR");
    }
  if (const char *targetQtVersion =
      target->GetLinkInterfaceDependentStringProperty("QT_MAJOR_VERSION", ""))
    {
    qtVersion = targetQtVersion;
    }
  if (qtVersion)
    {
    makefile->AddDefinition("_target_qt_version", qtVersion);
    }

  std::vector<std::string> skipUic;
  std::vector<std::string> skipMoc;
  std::vector<std::string> mocSources;
  std::vector<std::string> mocHeaders;
  std::map<std::string, std::string> configIncludes;
  std::map<std::string, std::string> configDefines;
  std::map<std::string, std::string> configUicOptions;

  if (target->GetPropertyAsBool("AUTOMOC")
      || target->GetPropertyAsBool("AUTOUIC")
      || target->GetPropertyAsBool("AUTORCC"))
    {
    SetupSourceFiles(target, skipMoc, mocSources, mocHeaders, skipUic);
    }
  makefile->AddDefinition("_cpp_files",
          cmOutputConverter::EscapeForCMake(cmJoin(mocSources, ";")).c_str());
  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    SetupAutoMocTarget(target, autogenTargetName,
                             skipMoc, mocHeaders,
                             configIncludes, configDefines);
    }
  if (target->GetPropertyAsBool("AUTOUIC"))
    {
    SetupAutoUicTarget(target, skipUic, configUicOptions);
    }
  if (target->GetPropertyAsBool("AUTORCC"))
    {
    SetupAutoRccTarget(target);
    }

  const char* cmakeRoot = makefile->GetSafeDefinition("CMAKE_ROOT");
  std::string inputFile = cmakeRoot;
  inputFile += "/Modules/AutogenInfo.cmake.in";
  std::string outputFile = targetDir;
  outputFile += "/AutogenInfo.cmake";
  makefile->AddDefinition("_qt_rcc_inputs",
              makefile->GetDefinition("_qt_rcc_inputs_" + target->GetName()));
  makefile->ConfigureFile(inputFile.c_str(), outputFile.c_str(),
                          false, true, false);

  // Ensure we have write permission in case .in was read-only.
  mode_t perm = 0;
#if defined(_WIN32) && !defined(__CYGWIN__)
  mode_t mode_write = S_IWRITE;
#else
  mode_t mode_write = S_IWUSR;
#endif
  cmSystemTools::GetPermissions(outputFile, perm);
  if (!(perm & mode_write))
    {
    cmSystemTools::SetPermissions(outputFile, perm | mode_write);
    }
  if (!configDefines.empty()
      || !configIncludes.empty()
      || !configUicOptions.empty())
    {
    cmsys::ofstream infoFile(outputFile.c_str(), std::ios::app);
    if ( !infoFile )
      {
      std::string error = "Internal CMake error when trying to open file: ";
      error += outputFile.c_str();
      error += " for writing.";
      cmSystemTools::Error(error.c_str());
      return;
      }
    if (!configDefines.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configDefines.begin(), end = configDefines.end();
            it != end; ++it)
        {
        infoFile << "set(AM_MOC_COMPILE_DEFINITIONS_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    if (!configIncludes.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configIncludes.begin(), end = configIncludes.end();
            it != end; ++it)
        {
        infoFile << "set(AM_MOC_INCLUDES_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    if (!configUicOptions.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configUicOptions.begin(), end = configUicOptions.end();
            it != end; ++it)
        {
        infoFile << "set(AM_UIC_TARGET_OPTIONS_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    }
}